

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

AsmJsScriptFunction * __thiscall
Js::JavascriptLibrary::CreateAsmJsScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  BOOL BVar4;
  ScriptFunctionType *deferredPrototypeType;
  undefined4 *puVar5;
  Recycler *pRVar6;
  FunctionWithComputedName<Js::AsmJsScriptFunction> *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  TVar3 = ((proxy->functionInfo).ptr)->attributes;
  if ((TVar3 >> 0x19 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x18f8,"(!proxy->GetFunctionInfo()->HasHomeObj())",
                                "!proxy->GetFunctionInfo()->HasHomeObj()");
    if (!bVar2) goto LAB_00bf0442;
    *puVar5 = 0;
    TVar3 = ((proxy->functionInfo).ptr)->attributes;
  }
  if ((TVar3 >> 0x17 & 1) == 0) {
    local_50 = (undefined1  [8])&AsmJsScriptFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_765c5cc;
    data.filename._0_4_ = 0x18fd;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00bf0442;
      *puVar5 = 0;
    }
    this_00 = (FunctionWithComputedName<Js::AsmJsScriptFunction> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar6,0x50);
    if (this_00 == (FunctionWithComputedName<Js::AsmJsScriptFunction> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00bf0442:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    AsmJsScriptFunction::AsmJsScriptFunction
              ((AsmJsScriptFunction *)this_00,proxy,deferredPrototypeType);
  }
  else {
    local_50 = (undefined1  [8])&FunctionWithComputedName<Js::AsmJsScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_765c5cc;
    data.filename._0_4_ = 0x18fb;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00bf0442;
      *puVar5 = 0;
    }
    this_00 = (FunctionWithComputedName<Js::AsmJsScriptFunction> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar6,0x58);
    if (this_00 == (FunctionWithComputedName<Js::AsmJsScriptFunction> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00bf0442;
      *puVar5 = 0;
    }
    FunctionWithComputedName<Js::AsmJsScriptFunction>::FunctionWithComputedName
              (this_00,proxy,deferredPrototypeType);
  }
  return &this_00->super_AsmJsScriptFunction;
}

Assistant:

AsmJsScriptFunction* JavascriptLibrary::CreateAsmJsScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        Assert(!proxy->GetFunctionInfo()->HasHomeObj());
        if (proxy->GetFunctionInfo()->HasComputedName())
        {
            return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, AsmJsScriptFunctionWithComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, AsmJsScriptFunction, proxy, deferredPrototypeType);
    }